

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O1

void __thiscall ManyDoublesRoundtripTest::RunShard(ManyDoublesRoundtripTest *this,int shard)

{
  int *piVar1;
  LiteralType literal_type;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *message;
  AssertionResult gtest_ar;
  uint64_t bits;
  uint64_t new_bits;
  char buffer [100];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  int local_d0;
  int local_cc;
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertHelper local_b8;
  ulong local_b0;
  ManyDoublesRoundtripTest *local_a8;
  uint64_t local_a0;
  char local_98 [104];
  
  uVar6 = (ulong)(uint)shard;
  local_d0 = -1;
  local_cc = shard;
  local_a8 = this;
  while( true ) {
    uVar5 = (uint)uVar6;
    if ((local_cc == 0) && (iVar4 = (int)(uVar6 >> 0x18), iVar4 != local_d0)) {
      printf("value: 0x%08x (%d%%)\r",uVar6,
             (ulong)(uint)(int)(((double)uVar6 * 100.0) / 4294967295.0));
      fflush(_stdout);
      local_d0 = iVar4;
    }
    local_b0 = uVar6 << 0x20 | uVar6;
    wabt::WriteDoubleHex(local_98,100,local_b0);
    sVar3 = strlen(local_98);
    local_d8.ptr_ = local_d8.ptr_ & 0xffffffff00000000;
    literal_type = Nan - ((local_b0 & 0xfffffffffffff) == 0);
    if ((~local_b0 & 0x7ff0000000000000) != 0) {
      literal_type = Hexfloat;
    }
    local_b8.data_._0_4_ = wabt::ParseDouble(literal_type,local_98,local_98 + (int)sVar3,&local_a0);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_c8,"Result::Ok",
               "ParseDouble(ClassifyDouble(bits), buffer, buffer + len, &new_bits)",
               (Enum *)&local_d8,(Result *)&local_b8);
    if (local_c8[0] == (internal)0x0) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_c8,"new_bits","bits",&local_a0,&local_b0);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_c0.ptr_)->_M_dataplus)._M_p;
      }
      iVar4 = 0x100;
      goto LAB_0011ff43;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    piVar1 = &(local_a8->super_ThreadedTest).num_threads_;
    uVar6 = (ulong)(uVar5 + *piVar1);
    if (CARRY4(uVar5,*piVar1)) {
      if (local_cc == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  }
  testing::Message::Message((Message *)&local_d8);
  if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_c0.ptr_)->_M_dataplus)._M_p;
  }
  iVar4 = 0xff;
LAB_0011ff43:
  testing::internal::AssertHelper::AssertHelper
            (&local_b8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
             ,iVar4,message);
  testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_b8);
  if (local_d8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8.ptr_ + 8))();
    }
    local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      WriteDoubleHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint64_t new_bits;
      ASSERT_EQ(Result::Ok, ParseDouble(ClassifyDouble(bits), buffer,
                                        buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }